

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::LValue::load(LValue *this)

{
  bool bVar1;
  add_pointer_t<const_slang::ast::LValue::Concat> ptVar2;
  Path *pPVar3;
  const_iterator pvVar4;
  SmallVectorBase<slang::SVInt> *in_RDI;
  variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *elem_2;
  const_iterator __end2;
  const_iterator __begin2;
  SmallVector<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>,_4UL>
  *__range2;
  ConstantValue result;
  Path *path;
  LValue *elem_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *__range4_1;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> vals_1;
  LValue *elem;
  const_iterator __end4;
  const_iterator __begin4;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *__range4;
  SmallVector<slang::SVInt,_2UL> vals;
  add_pointer_t<const_slang::ast::LValue::Concat> concat;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  SmallVectorBase<slang::SVInt> *in_stack_fffffffffffffe40;
  ConstantValue *this_00;
  SmallVector<slang::SVInt,_2UL> *__range;
  SmallVectorBase<slang::SVInt> *this_01;
  size_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  const_iterator local_178;
  __normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
  local_100;
  add_pointer_t<const_slang::ast::LValue::Concat> local_f8;
  ConstantValue local_f0 [2];
  span<const_slang::SVInt,_18446744073709551615UL> in_stack_ffffffffffffff60;
  __normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
  local_70;
  add_pointer_t<const_slang::ast::LValue::Concat> local_68;
  SmallVector<slang::SVInt,_2UL> local_50;
  
  this_01 = in_RDI;
  bVar1 = bad((LValue *)0xa2c426);
  if (bVar1) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe40,
               (nullptr_t)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  }
  else {
    ptVar2 = std::
             get_if<slang::ast::LValue::Concat,std::monostate,slang::ast::LValue::Path,slang::ast::LValue::Concat>
                       ((variant<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                         *)0xa2c449);
    if (ptVar2 == (add_pointer_t<const_slang::ast::LValue::Concat>)0x0) {
      pPVar3 = std::
               get<slang::ast::LValue::Path,std::monostate,slang::ast::LValue::Path,slang::ast::LValue::Concat>
                         ((variant<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           *)0xa2c7de);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffe40,
                 (ConstantValue *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      local_178 = SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
                  ::begin(&(pPVar3->elements).
                           super_SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
                         );
      pvVar4 = SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
               ::end(&(pPVar3->elements).
                      super_SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
                    );
      for (; local_178 != pvVar4; local_178 = local_178 + 1) {
        in_stack_fffffffffffffe3f =
             slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa2c84e);
        if (!(bool)in_stack_fffffffffffffe3f) {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffe40,
                     (nullptr_t)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
          goto LAB_00a2c8df;
        }
        std::
        visit<slang::ast::LValue::load()const::__0,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>const&>
                  ((anon_class_8_1_6971b95b *)in_stack_fffffffffffffe40,
                   (variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                    *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      }
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffe40,
                 (ConstantValue *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
LAB_00a2c8df:
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa2c8e9);
    }
    else if (ptVar2->kind == Packed) {
      __range = &local_50;
      SmallVector<slang::SVInt,_2UL>::SmallVector((SmallVector<slang::SVInt,_2UL> *)0xa2c484);
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::size(&ptVar2->elems);
      local_68 = ptVar2;
      SmallVectorBase<slang::SVInt>::reserve(this_01,(size_type)__range);
      ptVar2 = local_68;
      local_70._M_current =
           (LValue *)
           std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::begin
                     ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
                      CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::end
                ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                          ((__normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                            *)in_stack_fffffffffffffe40,
                           (__normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
        ::operator*(&local_70);
        load((LValue *)ptVar2);
        slang::ConstantValue::integer((ConstantValue *)__range);
        SmallVectorBase<slang::SVInt>::push_back
                  (in_stack_fffffffffffffe40,
                   (SVInt *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        SVInt::~SVInt((SVInt *)this_01);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa2c56e);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
        ::operator++(&local_70);
      }
      std::span<const_slang::SVInt,_18446744073709551615UL>::
      span<slang::SmallVector<slang::SVInt,_2UL>_&>
                ((span<const_slang::SVInt,_18446744073709551615UL> *)this_01,__range);
      SVInt::concat(in_stack_ffffffffffffff60);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffe40,
                 (SVInt *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      SVInt::~SVInt((SVInt *)this_01);
      SmallVector<slang::SVInt,_2UL>::~SmallVector((SmallVector<slang::SVInt,_2UL> *)0xa2c644);
    }
    else {
      this_00 = local_f0;
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0xa2c68e);
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::size(&ptVar2->elems);
      local_f8 = ptVar2;
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      ptVar2 = local_f8;
      local_100._M_current =
           (LValue *)
           std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::begin
                     ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
                      CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::end
                ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                          ((__normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                            *)this_00,
                           (__normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
        ::operator*(&local_100);
        load((LValue *)ptVar2);
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::push_back
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_00,
                   (value_type *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa2c754);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::LValue_*,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
        ::operator++(&local_100);
      }
      slang::ConstantValue::ConstantValue
                (this_00,(Elements *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_01);
    }
  }
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue LValue::load() const {
    if (bad())
        return nullptr;

    auto concat = std::get_if<Concat>(&value);
    if (concat) {
        if (concat->kind == Concat::Packed) {
            SmallVector<SVInt> vals;
            vals.reserve(concat->elems.size());
            for (auto& elem : concat->elems)
                vals.push_back(elem.load().integer());
            return SVInt::concat(vals);
        }
        else {
            std::vector<ConstantValue> vals;
            vals.reserve(concat->elems.size());
            for (auto& elem : concat->elems)
                vals.push_back(elem.load());
            return vals;
        }
    }

    // Otherwise, we have an lvalue path. Walk the path and apply each element.
    auto& path = std::get<Path>(value);
    ConstantValue result = *path.base;
    for (auto& elem : path.elements) {
        if (!result)
            return nullptr;

        std::visit(
            [&result](auto&& arg) {
                using T = std::decay_t<decltype(arg)>;
                if constexpr (std::is_same_v<T, BitSlice>) {
                    result = result.getSlice(arg.range.upper(), arg.range.lower(), nullptr);
                }
                else if constexpr (std::is_same_v<T, ElementIndex>) {
                    if (arg.forceOutOfBounds) {
                        result = arg.defaultValue;
                    }
                    else if (result.isUnion()) {
                        // If we're selecting the active member all is well. If not,
                        // we need to return the default value because we have no
                        // idea what type this should be.
                        if (arg.index < 0 || result.unionVal()->activeMember != uint32_t(arg.index))
                            result = arg.defaultValue;
                    }
                    else if (arg.index < 0 || size_t(arg.index) >= result.size()) {
                        result = arg.defaultValue;
                    }
                    else if (result.isString()) {
                        result = SVInt(8, (uint64_t)result.str()[size_t(arg.index)], false);
                    }
                    else {
                        // Be careful not to assign to the result while
                        // still referencing its elements.
                        ConstantValue temp(std::move(result.at(size_t(arg.index))));
                        result = std::move(temp);
                    }
                }
                else if constexpr (std::is_same_v<T, ArraySlice>) {
                    result = result.getSlice(arg.range.upper(), arg.range.lower(),
                                             arg.defaultValue);
                }
                else if constexpr (std::is_same_v<T, ArrayLookup>) {
                    auto& map = *result.map();
                    if (auto it = map.find(arg.index); it != map.end()) {
                        // If we find the index in the target map, return the value.
                        ConstantValue temp(std::move(it->second));
                        result = std::move(temp);
                    }
                    else if (map.defaultValue) {
                        // Otherwise, if the map itself has a default set, use that.
                        ConstantValue temp(std::move(map.defaultValue));
                        result = std::move(temp);
                    }
                    else {
                        // Finally, fall back on whatever the default default is.
                        result = arg.defaultValue;
                    }
                }
                else {
                    static_assert(always_false<T>::value, "Missing case");
                }
            },
            elem);
    }

    return result;
}